

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::ClockingDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ClockingDeclarationSyntax *this,size_t index)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  __index_type _Var2;
  NamedBlockClauseSyntax *pNVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  switch(index) {
  case 0:
    pSVar1 = &(this->super_MemberSyntax).attributes;
    goto LAB_001590c7;
  case 1:
    uVar4._0_2_ = (this->globalOrDefault).kind;
    uVar4._2_1_ = (this->globalOrDefault).field_0x2;
    uVar4._3_1_ = (this->globalOrDefault).numFlags;
    uVar5 = (this->globalOrDefault).rawLen;
    uVar6 = *(undefined4 *)&(this->globalOrDefault).info;
    uVar7 = *(undefined4 *)((long)&(this->globalOrDefault).info + 4);
    break;
  case 2:
    uVar4._0_2_ = (this->clocking).kind;
    uVar4._2_1_ = (this->clocking).field_0x2;
    uVar4._3_1_ = (this->clocking).numFlags;
    uVar5 = (this->clocking).rawLen;
    uVar6 = *(undefined4 *)&(this->clocking).info;
    uVar7 = *(undefined4 *)((long)&(this->clocking).info + 4);
    break;
  case 3:
    uVar4._0_2_ = (this->blockName).kind;
    uVar4._2_1_ = (this->blockName).field_0x2;
    uVar4._3_1_ = (this->blockName).numFlags;
    uVar5 = (this->blockName).rawLen;
    uVar6 = *(undefined4 *)&(this->blockName).info;
    uVar7 = *(undefined4 *)((long)&(this->blockName).info + 4);
    break;
  case 4:
    uVar4._0_2_ = (this->at).kind;
    uVar4._2_1_ = (this->at).field_0x2;
    uVar4._3_1_ = (this->at).numFlags;
    uVar5 = (this->at).rawLen;
    uVar6 = *(undefined4 *)&(this->at).info;
    uVar7 = *(undefined4 *)((long)&(this->at).info + 4);
    break;
  case 5:
    pNVar3 = (NamedBlockClauseSyntax *)(this->event).ptr;
    goto LAB_001590d9;
  case 6:
    uVar4._0_2_ = (this->semi).kind;
    uVar4._2_1_ = (this->semi).field_0x2;
    uVar4._3_1_ = (this->semi).numFlags;
    uVar5 = (this->semi).rawLen;
    uVar6 = *(undefined4 *)&(this->semi).info;
    uVar7 = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  case 7:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->items).super_SyntaxListBase;
LAB_001590c7:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
LAB_001590dc:
    _Var2 = '\x01';
    goto LAB_001590ff;
  case 8:
    uVar4._0_2_ = (this->endClocking).kind;
    uVar4._2_1_ = (this->endClocking).field_0x2;
    uVar4._3_1_ = (this->endClocking).numFlags;
    uVar5 = (this->endClocking).rawLen;
    uVar6 = *(undefined4 *)&(this->endClocking).info;
    uVar7 = *(undefined4 *)((long)&(this->endClocking).info + 4);
    break;
  case 9:
    pNVar3 = this->endBlockName;
LAB_001590d9:
    *(NamedBlockClauseSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pNVar3;
    goto LAB_001590dc;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_001590fd;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar4;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar6;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar7;
LAB_001590fd:
  _Var2 = '\0';
LAB_001590ff:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ClockingDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return globalOrDefault;
        case 2: return clocking;
        case 3: return blockName;
        case 4: return at;
        case 5: return event.get();
        case 6: return semi;
        case 7: return &items;
        case 8: return endClocking;
        case 9: return endBlockName;
        default: return nullptr;
    }
}